

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stmt.h
# Opt level: O2

void __thiscall enact::ReturnStmt::~ReturnStmt(ReturnStmt *this)

{
  (this->super_Stmt)._vptr_Stmt = (_func_int **)&PTR__ReturnStmt_00124178;
  std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::~unique_ptr(&this->value);
  std::__cxx11::string::~string((string *)&(this->keyword).lexeme);
  return;
}

Assistant:

~ReturnStmt() override = default;